

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.hpp
# Opt level: O2

void __thiscall antlr::CharScanner::match(CharScanner *this,string *s)

{
  size_type sVar1;
  uint c;
  MismatchedCharException *this_00;
  size_type sVar2;
  uint expecting_;
  
  sVar1 = s->_M_string_length;
  sVar2 = 0;
  while( true ) {
    if (sVar1 == sVar2) {
      return;
    }
    c = (*(this->super_TokenStream)._vptr_TokenStream[3])(this,1);
    expecting_ = (uint)(byte)(s->_M_dataplus)._M_p[sVar2];
    if (c != expecting_) break;
    (*(this->super_TokenStream)._vptr_TokenStream[8])(this);
    sVar2 = sVar2 + 1;
  }
  this_00 = (MismatchedCharException *)__cxa_allocate_exception(0x90);
  MismatchedCharException::MismatchedCharException(this_00,c,expecting_,false,this);
  __cxa_throw(this_00,&MismatchedCharException::typeinfo,
              MismatchedCharException::~MismatchedCharException);
}

Assistant:

virtual void match(const ANTLR_USE_NAMESPACE(std)string& s)
	{
		size_t len = s.length();

		for (size_t i = 0; i < len; i++)
		{
			// the & 0xFF is here to prevent sign extension lateron
			int la_1 = LA(1), c = (s[i] & 0xFF);

			if ( la_1 != c )
				throw MismatchedCharException(la_1, c, false, this);

			consume();
		}
	}